

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok.c
# Opt level: O0

void unknown_toUtf16(ENCODING *enc,char **fromP,char *fromLim,unsigned_short **toP,
                    unsigned_short *toLim)

{
  unsigned_short *puVar1;
  int iVar2;
  unsigned_short **ppuVar3;
  bool bVar4;
  unsigned_short local_32;
  unsigned_short c;
  unsigned_short *toLim_local;
  unsigned_short **toP_local;
  char *fromLim_local;
  char **fromP_local;
  ENCODING *enc_local;
  
  ppuVar3 = (unsigned_short **)fromLim;
  while( true ) {
    bVar4 = false;
    if (*fromP != fromLim) {
      bVar4 = *toP != toLim;
    }
    if (!bVar4) break;
    local_32 = *(unsigned_short *)((long)enc[3].literalScanners + (ulong)(byte)**fromP * 2 + 0x18);
    if (local_32 == 0) {
      iVar2 = (*enc[3].literalScanners[1])((ENCODING *)enc[3].sameName,*fromP,(char *)ppuVar3,fromP)
      ;
      local_32 = (unsigned_short)iVar2;
      *fromP = *fromP + (int)(*(byte *)((long)enc[1].scanners + (ulong)(byte)**fromP) - 3);
    }
    else {
      *fromP = *fromP + 1;
    }
    puVar1 = *toP;
    *toP = puVar1 + 1;
    *puVar1 = local_32;
    ppuVar3 = toP;
  }
  return;
}

Assistant:

static
void unknown_toUtf16(const ENCODING *enc,
                     const char **fromP, const char *fromLim,
                     unsigned short **toP, const unsigned short *toLim)
{
  while (*fromP != fromLim && *toP != toLim) {
    unsigned short c
      = ((const struct unknown_encoding *)enc)->utf16[(unsigned char)**fromP];
    if (c == 0) {
      c = (unsigned short)((const struct unknown_encoding *)enc)
           ->convert(((const struct unknown_encoding *)enc)->userData, *fromP);
      *fromP += ((const struct normal_encoding *)enc)->type[(unsigned char)**fromP]
                 - (BT_LEAD2 - 2);
    }
    else
      (*fromP)++;
    *(*toP)++ = c;
  }
}